

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueStore.cpp
# Opt level: O0

void __thiscall xercesc_4_0::ValueStore::startValueScope(ValueStore *this)

{
  XMLSize_t XVar1;
  IC_Field *key;
  XMLSize_t local_20;
  XMLSize_t i;
  XMLSize_t count;
  ValueStore *this_local;
  
  this->fValuesCount = 0;
  XVar1 = IdentityConstraint::getFieldCount(this->fIdentityConstraint);
  for (local_20 = 0; local_20 < XVar1; local_20 = local_20 + 1) {
    key = IdentityConstraint::getFieldAt(this->fIdentityConstraint,local_20);
    FieldValueMap::put(&this->fValues,key,(DatatypeValidator *)0x0,(XMLCh *)0x0);
  }
  return;
}

Assistant:

void ValueStore::startValueScope() {

    fValuesCount = 0;

    XMLSize_t count = fIdentityConstraint->getFieldCount();

    for (XMLSize_t i = 0; i < count; i++) {
        fValues.put(fIdentityConstraint->getFieldAt(i), 0, 0);
    }
}